

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stream-reader.hh
# Opt level: O3

bool __thiscall tinyusdz::StreamReader::read8(StreamReader *this,int64_t *ret)

{
  ulong uVar1;
  ulong uVar2;
  ulong uVar3;
  uint uVar4;
  ulong uVar6;
  ulong uVar7;
  uint uVar8;
  uint uVar10;
  uint uVar12;
  ulong uVar14;
  ulong uVar15;
  ulong uVar5;
  ulong uVar9;
  ulong uVar11;
  ulong uVar13;
  
  uVar2 = this->length_;
  uVar1 = this->idx_ + 8;
  if (uVar1 <= uVar2) {
    uVar7 = *(ulong *)(this->binary_ + this->idx_);
    uVar9 = uVar7 >> 8;
    uVar8 = (uint)(uVar7 >> 8);
    uVar11 = uVar7 >> 0x10;
    uVar10 = (uint)(uVar7 >> 0x10);
    uVar5 = uVar7 >> 0x18;
    uVar4 = (uint)(uVar7 >> 0x18);
    uVar13 = uVar7 >> 0x20;
    uVar12 = (uint)(uVar7 >> 0x20);
    uVar15 = uVar7 >> 0x28;
    uVar14 = uVar7 >> 0x30;
    uVar3 = uVar7 >> 0x30;
    uVar6 = uVar7 >> 0x38;
    if (this->swap_endian_ == true) {
      uVar15 = uVar7 & 0xff;
      uVar7 = uVar6;
      uVar13 = uVar5;
      uVar6 = uVar15;
      uVar15 = uVar11;
      uVar14 = uVar9;
      uVar4 = uVar12;
      uVar10 = uVar12 >> 8;
      uVar8 = (uint)(ushort)uVar3;
    }
    *ret = uVar7 & 0xff |
           (ulong)((uVar8 & 0xff) << 8) |
           (ulong)((uVar10 & 0xff) << 0x10) |
           (ulong)(uVar4 << 0x18) |
           (uVar13 & 0xff) << 0x20 |
           (uVar15 & 0xff) << 0x28 | (uVar14 & 0xff) << 0x30 | uVar6 << 0x38;
    this->idx_ = this->idx_ + 8;
  }
  return uVar1 <= uVar2;
}

Assistant:

bool read8(int64_t *ret) const {
    if ((idx_ + 8) > length_) {
      return false;
    }

    int64_t val;
    memcpy(&val, &binary_[idx_], sizeof(val));

    if (swap_endian_) {
      swap8(&val);
    }

    (*ret) = val;
    idx_ += 8;

    return true;
  }